

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_i2p_resolve(torrent *this,error_code *ec,char *dest)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  pointer this_00;
  torrent_peer *ptVar4;
  pex_flags_t local_112;
  peer_source_flags_t local_111;
  string_view local_110;
  undefined1 local_100 [8];
  torrent_state st;
  char *dest_local;
  error_code *ec_local;
  torrent *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if ((bVar1) &&
     (uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])(), (uVar2 & 1) != 0)) {
    boost::system::error_code::message_abi_cxx11_
              ((string *)
               &st.erased.
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,ec);
    uVar3 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"i2p_resolve error: %s",uVar3);
    ::std::__cxx11::string::~string
              ((string *)
               &st.erased.
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (((!bVar1) && ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) &&
     (uVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x11])(), (uVar2 & 1) == 0)) {
    need_peer_list(this);
    get_peer_list_state((torrent_state *)local_100,this);
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,dest);
    local_111.m_val = '\x01';
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::bitfield_flag
              (&local_112);
    ptVar4 = peer_list::add_i2p_peer
                       (this_00,local_110,local_111,local_112,(torrent_state *)local_100);
    if (ptVar4 != (torrent_peer *)0x0) {
      state_updated(this);
    }
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    update_want_peers(this);
    torrent_state::~torrent_state((torrent_state *)local_100);
  }
  return;
}

Assistant:

void torrent::on_i2p_resolve(error_code const& ec, char const* dest) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		COMPLETE_ASYNC("torrent::on_i2p_resolve");
#ifndef TORRENT_DISABLE_LOGGING
		if (ec && should_log())
			debug_log("i2p_resolve error: %s", ec.message().c_str());
#endif
		if (ec || m_abort || m_ses.is_aborted()) return;

		need_peer_list();
		torrent_state st = get_peer_list_state();
		if (m_peer_list->add_i2p_peer(dest, peer_info::tracker, {}, &st))
			state_updated();
		peers_erased(st.erased);

		update_want_peers();
	}
	catch (...) { handle_exception(); }